

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderSourceReplaceCase::verifyShaderSourceReplaced
          (ShaderSourceReplaceCase *this,Shader *shader,string *firstSource,string *secondSource)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  __type_conflict _Var3;
  bool bVar4;
  char *description;
  string result;
  undefined1 local_1a8 [384];
  
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  readSource_abi_cxx11_(&result,this,shader);
  _Var3 = std::operator==(&result,firstSource);
  if (_Var3) {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Fail, source was not replaced.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    description = "Shader source nor replaced";
  }
  else {
    bVar4 = std::operator!=(&result,secondSource);
    if (!bVar4) goto LAB_00f88656;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Fail, invalid shader source.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    description = "Invalid source";
  }
  tcu::TestContext::setTestResult
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,description);
LAB_00f88656:
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

void verifyShaderSourceReplaced (glu::Shader& shader, const std::string& firstSource, const std::string& secondSource)
	{
		TestLog&			log		= m_testCtx.getLog();
		const std::string	result	= readSource(shader);

		if (result == firstSource)
		{
			log << TestLog::Message << "Fail, source was not replaced." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader source nor replaced");
		}
		else if (result != secondSource)
		{
			log << TestLog::Message << "Fail, invalid shader source." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid source");
		}
	}